

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O0

int align_byte_sequence(rtr_bgpsec *data,stream *s,align_type type)

{
  long in_FS_OFFSET;
  rtr_signature_seg *local_40;
  rtr_signature_seg *tmp_sig;
  rtr_secure_path_seg *tmp_sec;
  align_type type_local;
  stream *s_local;
  rtr_bgpsec *data_local;
  uint16_t sig_len;
  uint16_t afi;
  uint32_t asn;
  
  _sig_len = *(long *)(in_FS_OFFSET + 0x28);
  data_local._4_4_ = 0;
  data_local._2_2_ = 0;
  data_local._4_4_ = htonl(data->target_as);
  write_stream(s,(void *)((long)&data_local + 4),4);
  if (type == VALIDATION) {
    local_40 = data->sigs->next;
  }
  else {
    local_40 = data->sigs;
  }
  for (tmp_sig = (rtr_signature_seg *)data->path; tmp_sig != (rtr_signature_seg *)0x0;
      tmp_sig = tmp_sig->next) {
    if (local_40 != (rtr_signature_seg *)0x0) {
      data_local._0_2_ = htons(local_40->sig_len);
      write_stream(s,local_40->ski,0x14);
      write_stream(s,&data_local,2);
      write_stream(s,local_40->signature,local_40->sig_len);
      local_40 = local_40->next;
    }
    write_stream(s,tmp_sig->ski,1);
    write_stream(s,tmp_sig->ski + 1,1);
    data_local._4_4_ = htonl(*(uint32_t *)(tmp_sig->ski + 4));
    write_stream(s,(void *)((long)&data_local + 4),4);
  }
  write_stream(s,data,1);
  data_local._2_2_ = htons(data->afi);
  write_stream(s,(void *)((long)&data_local + 2),2);
  write_stream(s,&data->safi,1);
  write_stream(s,&data->nlri->nlri_len,1);
  write_stream(s,data->nlri->nlri,(uint16_t)(data->nlri->nlri_len + 7 >> 3));
  if (*(long *)(in_FS_OFFSET + 0x28) == _sig_len) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int align_byte_sequence(const struct rtr_bgpsec *data, struct stream *s, enum align_type type)
{
	/* Variables used for network-to-host-order transformation. */
	uint32_t asn = 0;
	uint16_t afi = 0;

	/* Temp secure path and signature segments to prevent any
	 * alteration of the original data.
	 */
	struct rtr_secure_path_seg *tmp_sec = NULL;
	struct rtr_signature_seg *tmp_sig = NULL;

	/* The data alignment begins here, starting with the target ASN. */
	asn = htonl(data->target_as);
	write_stream(s, &asn, sizeof(asn));

	/* Depending on whether we are dealing with alignment for validation
	 * or signing, the first signature segment is skipped.
	 */
	if (type == VALIDATION)
		tmp_sig = data->sigs->next;
	else
		tmp_sig = data->sigs;

	tmp_sec = data->path;

	while (tmp_sec) {
		if (tmp_sig) {
			uint16_t sig_len = htons(tmp_sig->sig_len);

			/* Write the signature segment data to stream. */
			write_stream(s, tmp_sig->ski, SKI_SIZE);
			write_stream(s, &sig_len, sizeof(sig_len));
			write_stream(s, tmp_sig->signature, tmp_sig->sig_len);

			tmp_sig = tmp_sig->next;
		}

		/* Write the secure path segment data to stream. */
		write_stream(s, (uint8_t *)&tmp_sec->pcount, 1);
		write_stream(s, (uint8_t *)&tmp_sec->flags, 1);

		asn = htonl(tmp_sec->asn);
		write_stream(s, &asn, sizeof(asn));
		tmp_sec = tmp_sec->next;
	}

	/* Write the rest of the data to stream. */
	write_stream(s, (uint8_t *)&data->alg, 1);

	afi = htons(data->afi);
	write_stream(s, &afi, sizeof(afi));

	write_stream(s, (uint8_t *)&data->safi, 1);
	write_stream(s, (uint8_t *)&data->nlri->nlri_len, 1);

	/* Write the NLRI to stream */
	write_stream(s, data->nlri->nlri, NLRI_BYTE_LEN(data));

	return RTR_BGPSEC_SUCCESS;
}